

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdvalue.cpp
# Opt level: O2

void __thiscall Am_String_Data::Am_String_Data(Am_String_Data *this,char *in_value,bool copy)

{
  size_t sVar1;
  ulong uVar2;
  char *__dest;
  undefined3 in_register_00000011;
  ulong uVar3;
  
  (this->super_Am_Wrapper).refs = 1;
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002eb088;
  __dest = in_value;
  if (CONCAT31(in_register_00000011,copy) != 0) {
    sVar1 = strlen(in_value);
    uVar2 = (ulong)((int)sVar1 + 1);
    uVar3 = 0xffffffffffffffff;
    if (-1 < (long)uVar2) {
      uVar3 = uVar2;
    }
    __dest = (char *)operator_new__(uVar3);
    strcpy(__dest,in_value);
  }
  this->value = __dest;
  return;
}

Assistant:

Am_String_Data::Am_String_Data(const char *in_value, bool copy)
{
  if (copy) {
    char *temp;
    int size = strlen(in_value) + 1;
    temp = new char[size];
    strcpy(temp, in_value);
    value = temp;
  } else
    value = in_value;
}